

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.h
# Opt level: O2

string * __thiscall
cppcms::filters::streamable::
to_string<cppcms::stream_it<cppcms::url_mapper::data,cppcms::url_mapper::data::entry>>
          (string *__return_storage_ptr__,streamable *this,ios *out,void *ptr)

{
  void *__buf;
  ostringstream oss;
  long local_198 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::ios::copyfmt((ios *)((long)local_198 + *(long *)(local_198[0] + -0x18)));
  stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry>::write
            ((stream_it<cppcms::url_mapper::data,_cppcms::url_mapper::data::entry> *)out,
             (int)local_198,__buf,(size_t)ptr);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(std::ios &out,void const *ptr)
			{
				T const *object=reinterpret_cast<T const *>(ptr);
				std::ostringstream oss;
				oss.copyfmt(out);
				oss << *object;
				return oss.str();
			}